

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O3

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[107],char_const*,char[20],std::__cxx11::string,char[6],std::__cxx11::string,char[192]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [107],char **RestArgs,char (*RestArgs_1) [20],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *RestArgs_2,
               char (*RestArgs_3) [6],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *RestArgs_4,
               char (*RestArgs_5) [192])

{
  size_t sVar1;
  
  sVar1 = strlen(*FirstArg);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(ss + 0x10),*FirstArg,sVar1);
  FormatStrSS<std::__cxx11::stringstream,char_const*>(ss,RestArgs);
  FormatStrSS<std::__cxx11::stringstream,char[20],std::__cxx11::string,char[6],std::__cxx11::string,char[192]>
            (ss,RestArgs_1,RestArgs_2,RestArgs_3,RestArgs_4,RestArgs_5);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}